

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RatioSequence.cpp
# Opt level: O0

void __thiscall RatioSequence::RatioSequence(RatioSequence *this,string *ptA,string *ptB)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  size_type sVar2;
  reference pvVar3;
  Ratio *in_RDX;
  undefined8 *in_RDI;
  size_t i;
  size_t len;
  vector<double,_std::allocator<double>_> dblvecB;
  vector<double,_std::allocator<double>_> dblvecA;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strvecB;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strvecA;
  Ratio *item;
  Ratio *in_stack_fffffffffffffe40;
  size_type in_stack_fffffffffffffe78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  char *in_stack_fffffffffffffea0;
  string *in_stack_fffffffffffffea8;
  size_type local_150;
  string local_d8 [56];
  vector<double,_std::allocator<double>_> local_a0 [2];
  vector<double,_std::allocator<double>_> local_70 [4];
  
  *in_RDI = 0;
  std::vector<Ratio,_std::allocator<Ratio>_>::vector
            ((vector<Ratio,_std::allocator<Ratio>_> *)0x1fccbb);
  Tools::string_split(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98)
  ;
  Tools::string_split(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98)
  ;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  Tools::stringvec_to_doublevec
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffea8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_RDX);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  Tools::stringvec_to_doublevec
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffea8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_RDX);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::vector<double,_std::allocator<double>_>::size(local_70);
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::vector<double,_std::allocator<double>_>::size(local_a0);
  if (__lhs != pbVar1) {
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x10);
    std::operator+((char *)in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
    std::operator+(__lhs,(char *)pbVar1);
    std::operator+(__lhs,pbVar1);
    std::operator+(__lhs,(char *)pbVar1);
    std::invalid_argument::invalid_argument((invalid_argument *)pbVar1,local_d8);
    __cxa_throw(pbVar1,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  sVar2 = std::vector<double,_std::allocator<double>_>::size(local_70);
  std::vector<Ratio,_std::allocator<Ratio>_>::reserve
            ((vector<Ratio,_std::allocator<Ratio>_> *)in_stack_fffffffffffffe80,
             in_stack_fffffffffffffe78);
  for (local_150 = 0; local_150 < sVar2; local_150 = local_150 + 1) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_70,local_150);
    item = (Ratio *)*pvVar3;
    std::vector<double,_std::allocator<double>_>::operator[](local_a0,local_150);
    Ratio::Ratio(in_RDX,(double)__lhs,(double)in_stack_fffffffffffffe40);
    push_back_value((RatioSequence *)in_stack_fffffffffffffe40,item);
    Ratio::~Ratio(in_stack_fffffffffffffe40);
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_RDX);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_RDX);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_RDX);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_RDX);
  return;
}

Assistant:

RatioSequence::RatioSequence(string ptA, string ptB) {
    auto strvecA = Tools::string_split(ptA, ", ", "(,)");
    auto strvecB = Tools::string_split(ptB, ", ", "(,)");
    auto dblvecA = Tools::stringvec_to_doublevec(strvecA);
    auto dblvecB = Tools::stringvec_to_doublevec(strvecB);
    if (dblvecA.size() != dblvecB.size())
        throw std::invalid_argument("Coordinates have different numbers of dimensions: (" + ptA + "),(" + ptB + ")");
    size_t len = dblvecA.size();
    _RatioSequence.reserve(len);
    for (size_t i=0; i < len; ++i) {
        this->push_back_value(Ratio(dblvecA[i], dblvecB[i]));
    }
}